

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O1

btSoftBody *
btSoftBodyHelpers::CreatePatch
          (btSoftBodyWorldInfo *worldInfo,btVector3 *corner00,btVector3 *corner10,
          btVector3 *corner01,btVector3 *corner11,int resx,int resy,int fixeds,bool gendiags)

{
  int node2;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  btVector3 *x;
  btScalar *m;
  btSoftBody *this;
  int iVar7;
  long lVar8;
  int iVar9;
  int node0;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint node_count;
  int iVar13;
  int node1;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int local_4c;
  
  if (resy < 2 || resx < 2) {
    this = (btSoftBody *)0x0;
  }
  else {
    node_count = resy * resx;
    x = (btVector3 *)btAlignedAllocInternal((ulong)node_count << 4,0x10);
    m = (btScalar *)operator_new__((ulong)node_count * 4);
    iVar6 = resy + -1;
    lVar8 = 0;
    uVar10 = 0;
    do {
      fVar17 = (float)(int)uVar10 / (float)iVar6;
      fVar14 = (corner01->m_floats[2] - corner00->m_floats[2]) * fVar17 + corner00->m_floats[2];
      fVar1 = corner11->m_floats[2];
      fVar2 = corner10->m_floats[2];
      fVar15 = (float)*(undefined8 *)corner00->m_floats;
      fVar16 = (float)((ulong)*(undefined8 *)corner00->m_floats >> 0x20);
      fVar15 = ((float)*(undefined8 *)corner01->m_floats - fVar15) * fVar17 + fVar15;
      fVar16 = ((float)((ulong)*(undefined8 *)corner01->m_floats >> 0x20) - fVar16) * fVar17 +
               fVar16;
      uVar3 = *(undefined8 *)corner11->m_floats;
      fVar19 = (float)*(undefined8 *)corner10->m_floats;
      fVar20 = (float)((ulong)*(undefined8 *)corner10->m_floats >> 0x20);
      uVar12 = 0;
      lVar11 = lVar8;
      do {
        fVar18 = (float)(int)uVar12 / (float)(resx + -1);
        auVar4._4_4_ = fVar18 * ((((float)((ulong)uVar3 >> 0x20) - fVar20) * fVar17 + fVar20) -
                                fVar16) + fVar16;
        auVar4._0_4_ = fVar18 * ((((float)uVar3 - fVar19) * fVar17 + fVar19) - fVar15) + fVar15;
        auVar4._8_4_ = (((fVar1 - fVar2) * fVar17 + fVar2) - fVar14) * fVar18 + fVar14;
        auVar4._12_4_ = 0;
        *(undefined1 (*) [16])(x->m_floats + lVar11) = auVar4;
        *(undefined4 *)((long)m + lVar11) = 0x3f800000;
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 4;
      } while ((uint)resx != uVar12);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + (ulong)(uint)resx * 4;
    } while (uVar10 != (uint)resy);
    this = (btSoftBody *)btAlignedAllocInternal(0x690,0x10);
    btSoftBody::btSoftBody(this,worldInfo,node_count,x,m);
    if ((fixeds & 1U) != 0) {
      btSoftBody::setMass(this,0,0.0);
    }
    if ((fixeds & 2U) != 0) {
      btSoftBody::setMass(this,resx + -1,0.0);
    }
    if ((fixeds & 4U) != 0) {
      btSoftBody::setMass(this,iVar6 * resx,0.0);
    }
    if ((fixeds & 8U) != 0) {
      btSoftBody::setMass(this,iVar6 * resx + resx + -1,0.0);
    }
    if (x != (btVector3 *)0x0) {
      btAlignedFreeInternal(x);
    }
    operator_delete__(m);
    if (0 < resy) {
      iVar5 = 1;
      iVar6 = 0;
      iVar7 = 0;
      local_4c = resx;
      do {
        if (0 < resx) {
          node1 = local_4c;
          iVar13 = 0;
          do {
            iVar9 = iVar13 + 1;
            node0 = iVar6 + iVar13;
            if (iVar9 < resx) {
              btSoftBody::appendLink(this,node0,iVar5 + iVar13,(Material *)0x0,false);
            }
            if (iVar7 + 1 < resy) {
              btSoftBody::appendLink(this,node0,node1,(Material *)0x0,false);
            }
            if (iVar7 + 1 < resy && iVar9 < resx) {
              if ((iVar7 + iVar13 & 1U) == 0) {
                iVar13 = iVar13 + iVar5;
                btSoftBody::appendFace(this,node1,node0,iVar13,(Material *)0x0);
                btSoftBody::appendFace(this,node1,iVar13,node1 + 1,(Material *)0x0);
                node2 = node1;
              }
              else {
                node2 = node1 + 1;
                btSoftBody::appendFace(this,node0,iVar13 + iVar5,node2,(Material *)0x0);
                btSoftBody::appendFace(this,node0,node2,node1,(Material *)0x0);
                iVar13 = node0;
              }
              if (gendiags) {
                btSoftBody::appendLink(this,iVar13,node2,(Material *)0x0,false);
              }
            }
            node1 = node1 + 1;
            iVar13 = iVar9;
          } while (resx != iVar9);
        }
        iVar7 = iVar7 + 1;
        local_4c = local_4c + resx;
        iVar5 = iVar5 + resx;
        iVar6 = iVar6 + resx;
      } while (iVar7 != resy);
    }
  }
  return this;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreatePatch(btSoftBodyWorldInfo& worldInfo,const btVector3& corner00,
											   const btVector3& corner10,
											   const btVector3& corner01,
											   const btVector3& corner11,
											   int resx,
											   int resy,
											   int fixeds,
											   bool gendiags)
{
#define IDX(_x_,_y_)	((_y_)*rx+(_x_))
	/* Create nodes	*/ 
	if((resx<2)||(resy<2)) return(0);
	const int	rx=resx;
	const int	ry=resy;
	const int	tot=rx*ry;
	btVector3*	x=new btVector3[tot];
	btScalar*	m=new btScalar[tot];
	int iy;

	for(iy=0;iy<ry;++iy)
	{
		const btScalar	ty=iy/(btScalar)(ry-1);
		const btVector3	py0=lerp(corner00,corner01,ty);
		const btVector3	py1=lerp(corner10,corner11,ty);
		for(int ix=0;ix<rx;++ix)
		{
			const btScalar	tx=ix/(btScalar)(rx-1);
			x[IDX(ix,iy)]=lerp(py0,py1,tx);
			m[IDX(ix,iy)]=1;
		}
	}
	btSoftBody*		psb=new btSoftBody(&worldInfo,tot,x,m);
	if(fixeds&1)	psb->setMass(IDX(0,0),0);
	if(fixeds&2)	psb->setMass(IDX(rx-1,0),0);
	if(fixeds&4)	psb->setMass(IDX(0,ry-1),0);
	if(fixeds&8)	psb->setMass(IDX(rx-1,ry-1),0);
	delete[] x;
	delete[] m;
	/* Create links	and faces */ 
	for(iy=0;iy<ry;++iy)
	{
		for(int ix=0;ix<rx;++ix)
		{
			const int	idx=IDX(ix,iy);
			const bool	mdx=(ix+1)<rx;
			const bool	mdy=(iy+1)<ry;
			if(mdx) psb->appendLink(idx,IDX(ix+1,iy));
			if(mdy) psb->appendLink(idx,IDX(ix,iy+1));
			if(mdx&&mdy)
			{
				if((ix+iy)&1)
				{
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy),IDX(ix+1,iy+1));
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy+1),IDX(ix,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix,iy),IDX(ix+1,iy+1));
					}
				}
				else
				{
					psb->appendFace(IDX(ix,iy+1),IDX(ix,iy),IDX(ix+1,iy));
					psb->appendFace(IDX(ix,iy+1),IDX(ix+1,iy),IDX(ix+1,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix+1,iy),IDX(ix,iy+1));
					}
				}
			}
		}
	}
	/* Finished		*/ 
#undef IDX
	return(psb);
}